

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sbfInterface.c
# Opt level: O0

sbfError sbfInterface_parseAddress(char *s,sockaddr_in *sin)

{
  uint16_t uVar1;
  int iVar2;
  char *__s;
  char *pcVar3;
  ulong uVar4;
  undefined2 *in_RSI;
  unsigned_long ul;
  char *endptr;
  char *cp;
  char *copy;
  char *in_stack_ffffffffffffffd0;
  sbfError local_4;
  
  __s = sbfMemory_strdup(in_stack_ffffffffffffffd0);
  pcVar3 = strchr(__s,0x3a);
  if ((pcVar3 == (char *)0x0) || (pcVar3[1] == '\0')) {
    free(__s);
    local_4 = 0x16;
  }
  else {
    uVar4 = strtoul(pcVar3 + 1,(char **)&stack0xffffffffffffffd0,10);
    if ((uVar4 == 0) || ((0xffff < uVar4 || (*in_stack_ffffffffffffffd0 != '\0')))) {
      free(__s);
      local_4 = 0x22;
    }
    else {
      uVar1 = ntohs((uint16_t)uVar4);
      in_RSI[1] = uVar1;
      *pcVar3 = '\0';
      iVar2 = inet_pton(2,__s,in_RSI + 2);
      if (iVar2 == 0) {
        free(__s);
        local_4 = 0x16;
      }
      else {
        *in_RSI = 2;
        free(__s);
        local_4 = 0;
      }
    }
  }
  return local_4;
}

Assistant:

sbfError
sbfInterface_parseAddress (const char* s, struct sockaddr_in* sin)
{
    char*         copy;
    char*         cp;
    char*         endptr;
    unsigned long ul;

    copy = xstrdup (s);

    cp = strchr (copy, ':');
    if (cp == NULL || cp[1] == '\0')
    {
        free (copy);
        return EINVAL;
    }

    ul = strtoul (cp + 1, &endptr, 10);
    if (ul == 0 || ul > UINT16_MAX || *endptr != '\0')
    {
        free (copy);
        return ERANGE;
    }
    sin->sin_port = ntohs ((u_short)ul);

    *cp = '\0';
    if (inet_pton (AF_INET, copy, &sin->sin_addr) == 0)
    {
        free (copy);
        return EINVAL;
    }
    sin->sin_family = AF_INET;

    free (copy);
    return 0;
}